

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O1

void kratos::topological_sort_helper
               (GeneratorGraph *g,GeneratorNode *node,
               unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
               *visited,queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                        *queue)

{
  iterator *piVar1;
  ulong uVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  _Elt_pointer ppGVar5;
  set<kratos::Generator_*,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  *psVar6;
  GeneratorNode *node_00;
  __node_base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  ulong uVar9;
  __node_base_ptr p_Var10;
  GeneratorNode *local_38;
  GeneratorNode *node_local;
  
  local_38 = node;
  std::
  _Hashtable<kratos::GeneratorNode*,kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>,std::__detail::_Identity,std::equal_to<kratos::GeneratorNode*>,std::hash<kratos::GeneratorNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<kratos::GeneratorNode*&>
            ((_Hashtable<kratos::GeneratorNode*,kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>,std::__detail::_Identity,std::equal_to<kratos::GeneratorNode*>,std::hash<kratos::GeneratorNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)visited,&local_38);
  p_Var8 = (local_38->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  psVar6 = &local_38->children;
  do {
    if ((_Rb_tree_header *)p_Var8 == &(psVar6->_M_t)._M_impl.super__Rb_tree_header) {
      ppGVar5 = (queue->c).
                super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppGVar5 ==
          (queue->c).
          super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>>::
        _M_push_back_aux<kratos::GeneratorNode*const&>
                  ((deque<kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>> *)queue,
                   &local_38);
      }
      else {
        *ppGVar5 = local_38;
        piVar1 = &(queue->c).
                  super__Deque_base<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish;
        piVar1->_M_cur = piVar1->_M_cur + 1;
      }
      return;
    }
    node_00 = GeneratorGraph::get_node(g,*(Generator **)(p_Var8 + 1));
    uVar2 = (visited->_M_h)._M_bucket_count;
    uVar9 = (ulong)node_00 % uVar2;
    p_Var3 = (visited->_M_h)._M_buckets[uVar9];
    p_Var7 = (__node_base_ptr)0x0;
    if ((p_Var3 != (__node_base_ptr)0x0) &&
       (p_Var7 = p_Var3, p_Var10 = p_Var3->_M_nxt,
       node_00 != (GeneratorNode *)p_Var3->_M_nxt[1]._M_nxt)) {
      while (p_Var4 = p_Var10->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var7 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar2 != uVar9) ||
           (p_Var7 = p_Var10, p_Var10 = p_Var4, node_00 == (GeneratorNode *)p_Var4[1]._M_nxt))
        goto LAB_003826f3;
      }
      p_Var7 = (__node_base_ptr)0x0;
    }
LAB_003826f3:
    if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
      topological_sort_helper(g,node_00,visited,queue);
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
  } while( true );
}

Assistant:

void topological_sort_helper(GeneratorGraph *g, GeneratorNode *node,
                             std::unordered_set<GeneratorNode *> &visited,
                             std::queue<GeneratorNode *> &queue) {
    // mark it as visited
    visited.emplace(node);

    // visit all the child node
    for (auto const &child : node->children) {
        auto *child_node = g->get_node(child);
        if (visited.find(child_node) == visited.end()) {
            // visit it
            topological_sort_helper(g, child_node, visited, queue);
        }
    }
    queue.push(node);
}